

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall
StackArgWithFormalsTracker::SetStackSymInFormalsIndexMap
          (StackArgWithFormalsTracker *this,StackSym *sym,ArgSlot formalsIndex,ArgSlot formalsCount)

{
  JitArenaAllocator *this_00;
  code *pcVar1;
  bool bVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  StackSym **ppSVar3;
  undefined4 *puVar4;
  TrackAllocData local_48;
  ArgSlot local_1c;
  ArgSlot local_1a;
  ArgSlot formalsCount_local;
  StackSym *pSStack_18;
  ArgSlot formalsIndex_local;
  StackSym *sym_local;
  StackArgWithFormalsTracker *this_local;
  
  local_1c = formalsCount;
  local_1a = formalsIndex;
  pSStack_18 = sym;
  sym_local = (StackSym *)this;
  if (this->formalsIndexToStackSymMap == (StackSym **)0x0) {
    this_00 = this->alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&StackSym*::typeinfo,0,(ulong)formalsCount,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
               ,0x75e);
    this_01 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             this_00,&local_48);
    ppSVar3 = Memory::AllocateArray<Memory::JitArenaAllocator,StackSym*,false>
                        ((Memory *)this_01,(JitArenaAllocator *)Memory::JitArenaAllocator::AllocZero
                         ,0,(ulong)local_1c);
    this->formalsIndexToStackSymMap = ppSVar3;
  }
  if (local_1c <= local_1a) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x760,"(formalsIndex < formalsCount)","Out of range ?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->formalsIndexToStackSymMap[local_1a] = pSStack_18;
  return;
}

Assistant:

void
StackArgWithFormalsTracker::SetStackSymInFormalsIndexMap(StackSym * sym, Js::ArgSlot formalsIndex, Js::ArgSlot formalsCount)
{
    if(formalsIndexToStackSymMap == nullptr)
    {
        formalsIndexToStackSymMap = JitAnewArrayZ(alloc, StackSym*, formalsCount);
    }
    AssertMsg(formalsIndex < formalsCount, "Out of range ?");
    formalsIndexToStackSymMap[formalsIndex] = sym;
}